

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

size_t PAL_wcslen(char16_t *string)

{
  size_t sVar1;
  
  sVar1 = 0;
  if (string != (char16_t *)0x0) {
    for (; string[sVar1] != L'\0'; sVar1 = sVar1 + 1) {
    }
  }
  return sVar1;
}

Assistant:

__attribute__((no_instrument_function))
size_t
__cdecl
PAL_wcslen(
        const char16_t *string)
{
    size_t nChar = 0;

    // no logging here. PAL's internal output also uses this method

    if ( !string )
    {
        return 0;
    }

    while (*string++)
    {
        nChar++;
    }

    return nChar;
}